

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void rtreecheck(sqlite3_context *ctx,int nArg,sqlite3_value **apArg)

{
  u8 uVar1;
  sqlite3 *db;
  char *p;
  int iVar2;
  Vdbe *pVm;
  uchar *puVar3;
  uchar *puVar4;
  sqlite3_stmt *psVar5;
  char *z;
  uchar *puVar6;
  Vdbe *pVm_1;
  RtreeCheck local_88;
  
  if (nArg - 3U < 0xfffffffe) {
    sqlite3_result_error(ctx,"wrong number of arguments to function rtreecheck()",-1);
    return;
  }
  puVar3 = sqlite3_value_text(*apArg);
  if (nArg == 1) {
    puVar6 = (uchar *)"main";
    puVar4 = puVar3;
  }
  else {
    puVar4 = sqlite3_value_text(apArg[1]);
    puVar6 = puVar3;
  }
  db = ctx->pOut->db;
  local_88.zReport = (char *)0x0;
  local_88.nErr = 0;
  local_88._84_4_ = 0;
  local_88.nLeaf = 0;
  local_88.nNonLeaf = 0;
  local_88._64_8_ = 0;
  local_88.aCheckMapping[0] = (sqlite3_stmt *)0x0;
  local_88.aCheckMapping[1] = (sqlite3_stmt *)0x0;
  local_88.bInt = 0;
  local_88.nDim = 0;
  local_88.pGetNode = (sqlite3_stmt *)0x0;
  uVar1 = db->autoCommit;
  local_88.db = db;
  local_88.zDb = (char *)puVar6;
  local_88.zTab = (char *)puVar4;
  if (uVar1 != '\0') {
    iVar2 = sqlite3_exec(db,"BEGIN",(sqlite3_callback)0x0,(void *)0x0,(char **)0x0);
    local_88.rc = iVar2;
    if (iVar2 != 0) {
      iVar2 = -1;
      goto LAB_001c32f8;
    }
  }
  psVar5 = rtreeCheckPrepare(&local_88,"SELECT * FROM %Q.\'%q_rowid\'",puVar6,puVar4);
  if (psVar5 == (sqlite3_stmt *)0x0) {
    iVar2 = -1;
  }
  else {
    iVar2 = 1 - (uint)*(ushort *)(psVar5 + 0xc0);
    sqlite3_finalize(psVar5);
  }
  local_88._64_8_ = local_88._64_8_ & 0xffffffff00000000;
LAB_001c32f8:
  psVar5 = rtreeCheckPrepare(&local_88,"SELECT * FROM %Q.%Q",puVar6);
  if (psVar5 != (sqlite3_stmt *)0x0) {
    iVar2 = iVar2 + (uint)*(ushort *)(psVar5 + 0xc0);
    local_88.nDim = iVar2 / 2;
    if (iVar2 < 2) {
      rtreeCheckAppendMsg(&local_88,"Schema corrupt or not an rtree",(long)iVar2 % 2 & 0xffffffff);
    }
    else {
      iVar2 = sqlite3_step(psVar5);
      if (iVar2 == 100) {
        iVar2 = sqlite3_column_type(psVar5,1);
        local_88.bInt = (int)(iVar2 == 1);
      }
    }
    iVar2 = sqlite3_finalize(psVar5);
    if (iVar2 != 0xb) {
      local_88.rc = iVar2;
    }
  }
  if (0 < local_88.nDim) {
    if (local_88.rc == 0) {
      rtreeCheckNode(&local_88,0,(u8 *)0x0,1);
    }
    rtreeCheckCount(&local_88,"_rowid",(long)local_88.nLeaf);
    rtreeCheckCount(&local_88,"_parent",(long)local_88.nNonLeaf);
  }
  sqlite3_finalize(local_88.pGetNode);
  sqlite3_finalize(local_88.aCheckMapping[0]);
  sqlite3_finalize(local_88.aCheckMapping[1]);
  if (uVar1 == '\0') {
    iVar2 = local_88.rc;
  }
  else {
    iVar2 = sqlite3_exec(db,"END",(sqlite3_callback)0x0,(void *)0x0,(char **)0x0);
    if (local_88.rc != 0) {
      iVar2 = local_88.rc;
    }
    local_88.rc = iVar2;
  }
  p = local_88.zReport;
  if (iVar2 == 0) {
    z = "ok";
    if (local_88.zReport != (char *)0x0) {
      z = local_88.zReport;
    }
    sqlite3_result_text(ctx,z,-1,(_func_void_void_ptr *)0xffffffffffffffff);
  }
  else {
    sqlite3_result_error_code(ctx,iVar2);
  }
  sqlite3_free(p);
  return;
}

Assistant:

static void rtreecheck(
  sqlite3_context *ctx, 
  int nArg, 
  sqlite3_value **apArg
){
  if( nArg!=1 && nArg!=2 ){
    sqlite3_result_error(ctx, 
        "wrong number of arguments to function rtreecheck()", -1
    );
  }else{
    int rc;
    char *zReport = 0;
    const char *zDb = (const char*)sqlite3_value_text(apArg[0]);
    const char *zTab;
    if( nArg==1 ){
      zTab = zDb;
      zDb = "main";
    }else{
      zTab = (const char*)sqlite3_value_text(apArg[1]);
    }
    rc = rtreeCheckTable(sqlite3_context_db_handle(ctx), zDb, zTab, &zReport);
    if( rc==SQLITE_OK ){
      sqlite3_result_text(ctx, zReport ? zReport : "ok", -1, SQLITE_TRANSIENT);
    }else{
      sqlite3_result_error_code(ctx, rc);
    }
    sqlite3_free(zReport);
  }
}